

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::ProgramBinaryUniformResetCase::test(ProgramBinaryUniformResetCase *this)

{
  CallLogWrapper *this_00;
  string *this_01;
  TestLog *log;
  RenderContext *context;
  int iVar1;
  deUint32 dVar2;
  GLenum err;
  undefined4 extraout_var;
  TestError *this_02;
  allocator<char> local_429;
  deUint16 quadIndices [6];
  ProgramBinary binary;
  string local_3f8;
  string fragSrc;
  string vertSrc;
  float position [16];
  ShaderProgram program;
  ProgramSources sources;
  VertexArrayBinding vertexArrays [1];
  
  log = ((this->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
        m_log;
  getShaderSource_abi_cxx11_(&vertSrc,this,SHADERTYPE_VERTEX);
  getShaderSource_abi_cxx11_(&fragSrc,this,SHADERTYPE_FRAGMENT);
  glu::makeVtxFragSources(&sources,&vertSrc,&fragSrc);
  glu::ShaderProgram::ShaderProgram
            (&program,((this->super_ProgramBinaryCase).super_TestCase.m_context)->m_renderCtx,
             &sources);
  glu::operator<<(log,&program);
  if (program.m_program.m_info.linkOk != false) {
    binary.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    binary.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    binary.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ProgramBinaryCase::getProgramBinary
              (&this->super_ProgramBinaryCase,&binary,program.m_program.m_program);
    ProgramBinaryCase::verifyProgramBinary(&this->super_ProgramBinaryCase,&binary);
    setUniformsRandom(this,&program);
    this_01 = &vertexArrays[0].binding.name;
    vertexArrays[0].binding._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
    std::operator<<((ostream *)this_01,"Rendering test image and reloading binary");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)vertexArrays,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
    dVar2 = program.m_program.m_program;
    context = ((this->super_ProgramBinaryCase).super_TestCase.m_context)->m_renderCtx;
    iVar1 = (*context->_vptr_RenderContext[3])(context);
    position[0xc] = 1.0;
    position[0xd] = 1.0;
    position[0xe] = 0.0;
    position[0xf] = 1.0;
    position[8] = 1.0;
    position[9] = -1.0;
    position[10] = 0.0;
    position[0xb] = 1.0;
    position[4] = -1.0;
    position[5] = 1.0;
    position[6] = 0.0;
    position[7] = 1.0;
    position[0] = -1.0;
    position[1] = -1.0;
    position[2] = 0.0;
    position[3] = 1.0;
    quadIndices[0] = 0;
    quadIndices[1] = 1;
    quadIndices[2] = 2;
    quadIndices[3] = 2;
    quadIndices[4] = 1;
    quadIndices[5] = 3;
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x1680))(dVar2);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,"a_position",&local_429)
    ;
    glu::va::Float(vertexArrays,&local_3f8,4,4,0,position);
    std::__cxx11::string::~string((string *)&local_3f8);
    local_3f8._M_dataplus._M_p = (pointer)0x600000000;
    local_3f8._M_string_length._0_4_ = 1;
    local_3f8.field_2._M_allocated_capacity = (size_type)quadIndices;
    glu::draw(context,dVar2,1,vertexArrays,(PrimitiveList *)&local_3f8,(DrawUtilCallback *)0x0);
    std::__cxx11::string::~string((string *)&vertexArrays[0].binding.name);
    dVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
    glu::checkError(dVar2,"Draw test quad",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderApiTests.cpp"
                    ,0xd3);
    this_00 = &(this->super_ProgramBinaryCase).super_CallLogWrapper;
    glu::CallLogWrapper::glProgramBinary
              (this_00,program.m_program.m_program,binary.format,
               binary.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_start,
               (int)binary.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
               (int)binary.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
    err = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(err,"Failed to load program binary.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderApiTests.cpp"
                    ,0x498);
    verifyUniformsReset(this,&program);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&binary.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    glu::ShaderProgram::~ShaderProgram(&program);
    glu::ProgramSources::~ProgramSources(&sources);
    std::__cxx11::string::~string((string *)&fragSrc);
    std::__cxx11::string::~string((string *)&vertSrc);
    return;
  }
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_02,"Couldn\'t build program","program.isOk()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderApiTests.cpp"
             ,0x557);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void test (void)
	{
		TestLog&					log		= m_testCtx.getLog();

		const std::string			vertSrc	= getShaderSource(glu::SHADERTYPE_VERTEX);
		const std::string			fragSrc	= getShaderSource(glu::SHADERTYPE_FRAGMENT);

		const glu::ProgramSources	sources	= glu::makeVtxFragSources(vertSrc, fragSrc);

		glu::ShaderProgram			program	(m_context.getRenderContext(), sources);

		log << program;

		TCU_CHECK_MSG(program.isOk(), "Couldn't build program");

		{
			ProgramBinary binary;

			getProgramBinary(binary, program.getProgram());
			verifyProgramBinary(binary);

			setUniformsRandom(program);

			log << TestLog::Message << "Rendering test image and reloading binary" << TestLog::EndMessage;

			drawWithProgram(m_context.getRenderContext(), program.getProgram());
			loadProgramBinary(binary, program.getProgram());

			verifyUniformsReset(program);
		}
	}